

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenio::save_poly(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  polygon *ppVar1;
  facet *pfVar2;
  uint local_464;
  int local_444;
  int local_440;
  int k;
  int j;
  int i;
  char outpolyfilename [1024];
  polygon *p;
  facet *f;
  FILE *fout;
  char *filebasename_local;
  tetgenio *this_local;
  
  sprintf((char *)&j,"%s.poly",filebasename);
  printf("Saving poly to %s\n",&j);
  __stream = fopen((char *)&j,"w");
  fprintf(__stream,"%d  %d  %d  %d\n",0,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  if (this->mesh_dim == 2) {
    fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberofedges,
            (ulong)(this->edgemarkerlist != (int *)0x0));
    for (k = 0; k < this->numberofedges; k = k + 1) {
      fprintf(__stream,"%d  %4d  %4d",(ulong)(uint)(k + this->firstnumber),
              (ulong)(uint)this->edgelist[k << 1],(ulong)(uint)this->edgelist[k * 2 + 1]);
      if (this->edgemarkerlist != (int *)0x0) {
        fprintf(__stream,"  %d",(ulong)(uint)this->edgemarkerlist[k]);
      }
      fprintf(__stream,"\n");
    }
  }
  else {
    fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberoffacets,
            (ulong)(this->facetmarkerlist != (int *)0x0));
    for (k = 0; k < this->numberoffacets; k = k + 1) {
      pfVar2 = this->facetlist + k;
      if (this->facetmarkerlist == (int *)0x0) {
        local_464 = 0;
      }
      else {
        local_464 = this->facetmarkerlist[k];
      }
      fprintf(__stream,"%d  %d  %d  # %d\n",(ulong)(uint)pfVar2->numberofpolygons,
              (ulong)(uint)pfVar2->numberofholes,(ulong)local_464,
              (ulong)(uint)(k + this->firstnumber));
      for (local_440 = 0; local_440 < pfVar2->numberofpolygons; local_440 = local_440 + 1) {
        ppVar1 = pfVar2->polygonlist + local_440;
        fprintf(__stream,"%d  ",(ulong)(uint)ppVar1->numberofvertices);
        for (local_444 = 0; local_444 < ppVar1->numberofvertices; local_444 = local_444 + 1) {
          if ((local_444 + 1) % 10 == 0) {
            fprintf(__stream,"\n  ");
          }
          fprintf(__stream,"  %d",(ulong)(uint)ppVar1->vertexlist[local_444]);
        }
        fprintf(__stream,"\n");
      }
      for (local_440 = 0; local_440 < pfVar2->numberofholes; local_440 = local_440 + 1) {
        fprintf(__stream,"%d  %.12g  %.12g  %.12g\n",pfVar2->holelist[local_440 * 3],
                pfVar2->holelist[local_440 * 3 + 1],pfVar2->holelist[local_440 * 3 + 2],
                (ulong)(uint)(local_440 + this->firstnumber));
      }
    }
  }
  fprintf(__stream,"%d\n",(ulong)(uint)this->numberofholes);
  for (k = 0; k < this->numberofholes; k = k + 1) {
    fprintf(__stream,"%d  %.12g  %.12g",this->holelist[k * this->mesh_dim],
            this->holelist[k * this->mesh_dim + 1],(ulong)(uint)(k + this->firstnumber));
    if (this->mesh_dim == 3) {
      fprintf(__stream,"  %.12g",this->holelist[k * this->mesh_dim + 2]);
    }
    fprintf(__stream,"\n");
  }
  fprintf(__stream,"%d\n",(ulong)(uint)this->numberofregions);
  for (k = 0; k < this->numberofregions; k = k + 1) {
    if (this->mesh_dim == 2) {
      fprintf(__stream,"%d  %.12g  %.12g  %.12g  %.12g\n",this->regionlist[k << 2],
              this->regionlist[k * 4 + 1],this->regionlist[k * 4 + 2],this->regionlist[k * 4 + 3],
              (ulong)(uint)(k + this->firstnumber));
    }
    else {
      fprintf(__stream,"%d  %.12g  %.12g  %.12g  %.12g  %.12g\n",this->regionlist[k * 5],
              this->regionlist[k * 5 + 1],this->regionlist[k * 5 + 2],this->regionlist[k * 5 + 3],
              this->regionlist[k * 5 + 4],(ulong)(uint)(k + this->firstnumber));
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_poly(char* filebasename)
{
  FILE *fout;
  facet *f;
  polygon *p;
  char outpolyfilename[FILENAMESIZE];
  int i, j, k;

  sprintf(outpolyfilename, "%s.poly", filebasename);
  printf("Saving poly to %s\n", outpolyfilename);
  fout = fopen(outpolyfilename, "w");

  // The zero indicates that the vertices are in a separate .node file.
  //   Followed by number of dimensions, number of vertex attributes,
  //   and number of boundary markers (zero or one).
  fprintf(fout, "%d  %d  %d  %d\n", 0, mesh_dim, numberofpointattributes,
          pointmarkerlist != NULL ? 1 : 0);

  // Save segments or facets.
  if (mesh_dim == 2) {
    // Number of segments, number of boundary markers (zero or one).
    fprintf(fout, "%d  %d\n", numberofedges, edgemarkerlist != NULL ? 1 : 0);
    for (i = 0; i < numberofedges; i++) {
      fprintf(fout, "%d  %4d  %4d", i + firstnumber, edgelist[i * 2],
              edgelist[i * 2 + 1]);
      if (edgemarkerlist != NULL) {
        fprintf(fout, "  %d", edgemarkerlist[i]);
      }
      fprintf(fout, "\n");
    }
  } else {
    // Number of facets, number of boundary markers (zero or one).
    fprintf(fout, "%d  %d\n", numberoffacets, facetmarkerlist != NULL ? 1 : 0);
    for (i = 0; i < numberoffacets; i++) {
      f = &(facetlist[i]);
      fprintf(fout, "%d  %d  %d  # %d\n", f->numberofpolygons,f->numberofholes,
            facetmarkerlist != NULL ? facetmarkerlist[i] : 0, i + firstnumber);
      // Output polygons of this facet.
      for (j = 0; j < f->numberofpolygons; j++) {
        p = &(f->polygonlist[j]);
        fprintf(fout, "%d  ", p->numberofvertices);
        for (k = 0; k < p->numberofvertices; k++) {
          if (((k + 1) % 10) == 0) {
            fprintf(fout, "\n  ");
          }
          fprintf(fout, "  %d", p->vertexlist[k]);
        }
        fprintf(fout, "\n");
      }
      // Output holes of this facet.
      for (j = 0; j < f->numberofholes; j++) {
        fprintf(fout, "%d  %.12g  %.12g  %.12g\n", j + firstnumber,
           f->holelist[j * 3], f->holelist[j * 3 + 1], f->holelist[j * 3 + 2]);
      }
    }
  }

  // Save holes.
  fprintf(fout, "%d\n", numberofholes);
  for (i = 0; i < numberofholes; i++) {
    // Output x, y coordinates.
    fprintf(fout, "%d  %.12g  %.12g", i + firstnumber, holelist[i * mesh_dim],
            holelist[i * mesh_dim + 1]);
    if (mesh_dim == 3) {
      // Output z coordinate.
      fprintf(fout, "  %.12g", holelist[i * mesh_dim + 2]);
    }
    fprintf(fout, "\n");
  }

  // Save regions.
  fprintf(fout, "%d\n", numberofregions);
  for (i = 0; i < numberofregions; i++) {
    if (mesh_dim == 2) {
      // Output the index, x, y coordinates, attribute (region number)
      //   and maximum area constraint (maybe -1).
      fprintf(fout, "%d  %.12g  %.12g  %.12g  %.12g\n", i + firstnumber,
              regionlist[i * 4], regionlist[i * 4 + 1],
              regionlist[i * 4 + 2], regionlist[i * 4 + 3]);
    } else {
      // Output the index, x, y, z coordinates, attribute (region number)
      //   and maximum volume constraint (maybe -1).
      fprintf(fout, "%d  %.12g  %.12g  %.12g  %.12g  %.12g\n", i + firstnumber,
              regionlist[i * 5], regionlist[i * 5 + 1],
              regionlist[i * 5 + 2], regionlist[i * 5 + 3],
              regionlist[i * 5 + 4]);
    }
  }

  fclose(fout);  
}